

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

MockSpec<BasicTestExpr<2>_(bool)> * __thiscall
testing::internal::FunctionMocker<BasicTestExpr<2>_(bool)>::With
          (FunctionMocker<BasicTestExpr<2>_(bool)> *this,Matcher<bool> *m1)

{
  MockSpec<BasicTestExpr<2>_(bool)> *pMVar1;
  FunctionMockerBase<BasicTestExpr<2>_(bool)> *in_RDI;
  Matcher<bool> *in_stack_ffffffffffffffa8;
  
  FunctionMockerBase<BasicTestExpr<2>_(bool)>::current_spec(in_RDI);
  std::make_tuple<testing::Matcher<bool>const&>(in_stack_ffffffffffffffa8);
  MockSpec<BasicTestExpr<2>_(bool)>::SetMatchers
            ((MockSpec<BasicTestExpr<2>_(bool)> *)in_RDI,
             (ArgumentMatcherTuple *)in_stack_ffffffffffffffa8);
  std::tuple<testing::Matcher<bool>_>::~tuple((tuple<testing::Matcher<bool>_> *)0x1d15b1);
  pMVar1 = FunctionMockerBase<BasicTestExpr<2>_(bool)>::current_spec(in_RDI);
  return pMVar1;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1));
    return this->current_spec();
  }